

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infoclr_change_bg(Pixell bg)

{
  infoclr *iclr;
  Pixell bg_local;
  
  if (Metadpy->zg < bg) {
    bg_local._4_4_ = -1;
  }
  else {
    XSetBackground(Metadpy->dpy,Infoclr->gc,bg);
    bg_local._4_4_ = 0;
  }
  return bg_local._4_4_;
}

Assistant:

static errr Infoclr_change_bg(Pixell bg)
{
	infoclr *iclr = Infoclr;


	/*** Simple error checking of opr and clr ***/

	/* Check the 'Pixells' for realism */
	if (bg > Metadpy->zg) return (-1);

	/*** Change ***/

	/* Change */
	XSetBackground(Metadpy->dpy, iclr->gc, bg);

	/* Success */
	return (0);
}